

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5DlidxIterNextR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  uint uVar1;
  int iVar2;
  Fts5Data *pFVar3;
  Fts5DlidxLvl *pLvl;
  long lVar4;
  
  lVar4 = (long)iLvl;
  pLvl = pIter->aLvl + lVar4;
  uVar1 = fts5DlidxLvlNext(pLvl);
  pFVar3 = (Fts5Data *)(ulong)uVar1;
  if ((uVar1 != 0) && (iLvl + 1 < pIter->nLvl)) {
    uVar1 = fts5DlidxIterNextR(p,pIter,iLvl + 1);
    pFVar3 = (Fts5Data *)(ulong)uVar1;
    if (*(int *)((long)&pIter[1].aLvl[lVar4].pData + 4) == 0) {
      sqlite3_free(pLvl->pData);
      pIter->aLvl[lVar4].iFirstOff = 0;
      pIter->aLvl[lVar4].iLeafPgno = 0;
      pIter->aLvl[lVar4].iRowid = 0;
      pLvl->pData = (Fts5Data *)0x0;
      pIter->aLvl[lVar4].iOff = 0;
      pIter->aLvl[lVar4].bEof = 0;
      pFVar3 = fts5DataRead(p,lVar4 * 0x80000000 + ((ulong)(uint)pIter->iSegid << 0x25) +
                              0x1000000000 + (long)pIter[1].aLvl[lVar4].bEof);
      pLvl->pData = pFVar3;
      if (pFVar3 != (Fts5Data *)0x0) {
        iVar2 = fts5DlidxLvlNext(pLvl);
        return iVar2;
      }
    }
  }
  return (int)pFVar3;
}

Assistant:

static int fts5DlidxIterNextR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlNext(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterNextR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p, 
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ) fts5DlidxLvlNext(pLvl);
      }
    }
  }

  return pIter->aLvl[0].bEof;
}